

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxwell_dist.hpp
# Opt level: O0

result_type_conflict3 * __thiscall
trng::maxwell_dist<long_double>::pdf(maxwell_dist<long_double> *this,result_type_conflict3 x)

{
  result_type_conflict3 *prVar1;
  param_type *in_RSI;
  result_type_conflict3 *in_RDI;
  double __x;
  result_type_conflict3 t2;
  result_type_conflict3 x2;
  
  param_type::theta(in_RDI,in_RSI);
  param_type::theta(in_RDI,in_RSI);
  std::exp(__x);
  prVar1 = param_type::theta(in_RDI,in_RSI);
  return prVar1;
}

Assistant:

pdf(result_type x) const {
      const result_type x2{x * x};
      const result_type t2{P.theta() * P.theta()};
      return math::constants<result_type>::sqrt_2_over_pi * x2 * math::exp(-x2 / (2 * t2)) /
             (t2 * P.theta());
    }